

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

optional<slang::TimeScaleValue> slang::TimeScaleValue::fromLiteral(double value,TimeUnit unit)

{
  _Optional_base<slang::TimeScaleValue,_true,_true> _Var1;
  TimeUnit in_DIL;
  double in_XMM0_Qa;
  TimeScaleValue *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  TimeScaleValue local_17;
  TimeScaleValue local_15;
  TimeScaleValue local_13 [8];
  _Storage<slang::TimeScaleValue,_true> local_3;
  bool local_1;
  
  if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != 10.0) || (NAN(in_XMM0_Qa))) {
      if ((in_XMM0_Qa != 100.0) || (NAN(in_XMM0_Qa))) {
        std::optional<slang::TimeScaleValue>::optional((optional<slang::TimeScaleValue> *)&local_3);
      }
      else {
        TimeScaleValue(&local_17,in_DIL,Hundred);
        std::optional<slang::TimeScaleValue>::optional<slang::TimeScaleValue,_true>
                  ((optional<slang::TimeScaleValue> *)
                   CONCAT17(in_stack_ffffffffffffffe7,
                            CONCAT16(in_stack_ffffffffffffffe6,
                                     CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)))
                   ,in_stack_ffffffffffffffd8);
      }
    }
    else {
      TimeScaleValue(&local_15,in_DIL,Ten);
      std::optional<slang::TimeScaleValue>::optional<slang::TimeScaleValue,_true>
                ((optional<slang::TimeScaleValue> *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,
                                   CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))),
                 in_stack_ffffffffffffffd8);
    }
  }
  else {
    TimeScaleValue(local_13,in_DIL,One);
    std::optional<slang::TimeScaleValue>::optional<slang::TimeScaleValue,_true>
              ((optional<slang::TimeScaleValue> *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))),
               in_stack_ffffffffffffffd8);
  }
  _Var1._M_payload.super__Optional_payload_base<slang::TimeScaleValue>._M_engaged = local_1;
  _Var1._M_payload.super__Optional_payload_base<slang::TimeScaleValue>._M_payload = local_3;
  return (_Optional_base<slang::TimeScaleValue,_true,_true>)
         (_Optional_base<slang::TimeScaleValue,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<slang::TimeScaleValue>;
}

Assistant:

std::optional<TimeScaleValue> TimeScaleValue::fromLiteral(double value, TimeUnit unit) {
    if (value == 1)
        return TimeScaleValue(unit, TimeScaleMagnitude::One);
    if (value == 10)
        return TimeScaleValue(unit, TimeScaleMagnitude::Ten);
    if (value == 100)
        return TimeScaleValue(unit, TimeScaleMagnitude::Hundred);

    return std::nullopt;
}